

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateDuplicateExecutionModes(ValidationState_t *_)

{
  bool bVar1;
  Op OVar2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *this;
  DiagnosticStream *pDVar3;
  pair<std::_Rb_tree_const_iterator<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_bool> pVar4;
  pair<std::_Rb_tree_const_iterator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_bool>
  pVar5;
  string local_4f8;
  DiagnosticStream local_4d8;
  _Base_ptr local_300;
  byte local_2f8;
  value_type local_2ec;
  _Base_ptr local_2e0;
  byte local_2d8;
  uint local_2d0;
  undefined4 local_2cc;
  uint operand;
  DiagnosticStream local_2a8;
  _Base_ptr local_d0;
  byte local_c8;
  value_type local_c0;
  _Base_ptr local_b8;
  byte local_b0;
  ExecutionMode local_a8;
  uint local_a4;
  ExecutionMode mode;
  uint entry;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *__range2;
  anon_class_8_1_54a397ff lookupMode;
  set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
  seen_per_operand;
  set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
  seen_per_entry;
  ValidationState_t *__local;
  
  std::
  set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
  ::set((set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
         *)&seen_per_operand._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
  ::set((set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
         *)&lookupMode);
  __range2 = (vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *)_;
  this = ValidationState_t::ordered_instructions(_);
  __end2 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
           begin(this);
  inst = (Instruction *)
         std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::end
                   (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
                                *)&inst);
    if (!bVar1) {
      __local._4_4_ = SPV_SUCCESS;
LAB_00230883:
      local_2cc = 1;
      std::
      set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
      ::~set((set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
              *)&lookupMode);
      std::
      set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
      ::~set((set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
              *)&seen_per_operand._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return __local._4_4_;
    }
    _mode = __gnu_cxx::
            __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
            ::operator*(&__end2);
    OVar2 = Instruction::opcode(_mode);
    if ((OVar2 == OpExecutionMode) ||
       (OVar2 = Instruction::opcode(_mode), OVar2 == OpExecutionModeId)) {
      local_a4 = Instruction::GetOperandAs<unsigned_int>(_mode,0);
      local_a8 = Instruction::GetOperandAs<spv::ExecutionMode>(_mode,1);
      bVar1 = anon_unknown_1::PerEntryExecutionMode(local_a8);
      if (bVar1) {
        std::make_tuple<spv::ExecutionMode_const&,unsigned_int_const&>
                  ((ExecutionMode *)&local_c0,&local_a8);
        pVar4 = std::
                set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
                ::insert((set<std::tuple<spv::ExecutionMode,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int>_>_>
                          *)&seen_per_operand._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         &local_c0);
        local_d0 = (_Base_ptr)pVar4.first._M_node;
        local_c8 = pVar4.second;
        local_b8 = local_d0;
        local_b0 = local_c8;
        if (((local_c8 ^ 0xff) & 1) != 0) {
          ValidationState_t::diag(&local_2a8,_,SPV_ERROR_INVALID_ID,_mode);
          ValidateDuplicateExecutionModes(spvtools::val::ValidationState_t&)::$_0::operator()::
          ExecutionMode__const((string *)&operand,&__range2,local_a8);
          pDVar3 = DiagnosticStream::operator<<
                             (&local_2a8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &operand);
          pDVar3 = DiagnosticStream::operator<<
                             (pDVar3,(char (*) [69])
                                     " execution mode must not be specified multiple times per entry point"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          std::__cxx11::string::~string((string *)&operand);
          DiagnosticStream::~DiagnosticStream(&local_2a8);
          goto LAB_00230883;
        }
      }
      else {
        local_2d0 = Instruction::GetOperandAs<unsigned_int>(_mode,2);
        std::make_tuple<spv::ExecutionMode_const&,unsigned_int_const&,unsigned_int_const&>
                  ((ExecutionMode *)&local_2ec,&local_a8,&local_a4);
        pVar5 = std::
                set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
                ::insert((set<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>,_std::less<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::ExecutionMode,_unsigned_int,_unsigned_int>_>_>
                          *)&lookupMode,&local_2ec);
        local_300 = (_Base_ptr)pVar5.first._M_node;
        local_2f8 = pVar5.second;
        local_2e0 = local_300;
        local_2d8 = local_2f8;
        if (((local_2f8 ^ 0xff) & 1) != 0) {
          ValidationState_t::diag(&local_4d8,_,SPV_ERROR_INVALID_ID,_mode);
          ValidateDuplicateExecutionModes(spvtools::val::ValidationState_t&)::$_0::operator()::
          ExecutionMode__const(&local_4f8,&__range2,local_a8);
          pDVar3 = DiagnosticStream::operator<<(&local_4d8,&local_4f8);
          pDVar3 = DiagnosticStream::operator<<
                             (pDVar3,(char (*) [91])
                                     " execution mode must not be specified multiple times for the same entry point and operands"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          std::__cxx11::string::~string((string *)&local_4f8);
          DiagnosticStream::~DiagnosticStream(&local_4d8);
          goto LAB_00230883;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::Instruction_*,_std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t ValidateDuplicateExecutionModes(ValidationState_t& _) {
  using PerEntryKey = std::tuple<spv::ExecutionMode, uint32_t>;
  using PerOperandKey = std::tuple<spv::ExecutionMode, uint32_t, uint32_t>;
  std::set<PerEntryKey> seen_per_entry;
  std::set<PerOperandKey> seen_per_operand;

  const auto lookupMode = [&_](spv::ExecutionMode mode) -> std::string {
    spv_operand_desc desc = nullptr;
    if (_.grammar().lookupOperand(SPV_OPERAND_TYPE_EXECUTION_MODE,
                                  static_cast<uint32_t>(mode),
                                  &desc) == SPV_SUCCESS) {
      return std::string(desc->name);
    }
    return "Unknown";
  };

  for (const auto& inst : _.ordered_instructions()) {
    if (inst.opcode() != spv::Op::OpExecutionMode &&
        inst.opcode() != spv::Op::OpExecutionModeId) {
      continue;
    }

    const auto entry = inst.GetOperandAs<uint32_t>(0);
    const auto mode = inst.GetOperandAs<spv::ExecutionMode>(1);
    if (PerEntryExecutionMode(mode)) {
      if (!seen_per_entry.insert(std::make_tuple(mode, entry)).second) {
        return _.diag(SPV_ERROR_INVALID_ID, &inst)
               << lookupMode(mode)
               << " execution mode must not be specified multiple times per "
                  "entry point";
      }
    } else {
      // Execution modes allowed multiple times all take a single operand.
      const auto operand = inst.GetOperandAs<uint32_t>(2);
      if (!seen_per_operand.insert(std::make_tuple(mode, entry, operand))
               .second) {
        return _.diag(SPV_ERROR_INVALID_ID, &inst)
               << lookupMode(mode)
               << " execution mode must not be specified multiple times for "
                  "the same entry point and operands";
      }
    }
  }

  return SPV_SUCCESS;
}